

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

void StartCall(void)

{
  datatype dVar1;
  
  dVar1 = data_class(oldtabindex);
  if (dVar1 != dtprocedure) {
    error("Cannot call - this is not a procedure",linenum);
  }
  actionpush(oldtabindex);
  nextarg = oldtabindex;
  return;
}

Assistant:

void	StartCall(void)
{
    if (data_class(oldtabindex) != dtprocedure)
        error("Cannot call - this is not a procedure", linenum);
    actionpush(oldtabindex);
    nextarg = oldtabindex;
    
}